

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

int __thiscall
diligent_spirv_cross::CompilerGLSL::get_constant_mapping_to_workgroup_component
          (CompilerGLSL *this,SPIRConstant *c)

{
  bool bVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  int local_24;
  int index;
  SPIREntryPoint *entry_point;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  
  pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
  local_24 = -1;
  if (((pSVar3->workgroup_size).constant == 0) && (bVar1 = Bitset::get(&pSVar3->flags,0x26), bVar1))
  {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).self);
    if (uVar2 == (pSVar3->workgroup_size).id_x) {
      local_24 = 0;
    }
    else {
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).self);
      if (uVar2 == (pSVar3->workgroup_size).id_y) {
        local_24 = 1;
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(c->super_IVariant).self);
        if (uVar2 == (pSVar3->workgroup_size).id_z) {
          local_24 = 2;
        }
      }
    }
  }
  return local_24;
}

Assistant:

int CompilerGLSL::get_constant_mapping_to_workgroup_component(const SPIRConstant &c) const
{
	auto &entry_point = get_entry_point();
	int index = -1;

	// Need to redirect specialization constants which are used as WorkGroupSize to the builtin,
	// since the spec constant declarations are never explicitly declared.
	if (entry_point.workgroup_size.constant == 0 && entry_point.flags.get(ExecutionModeLocalSizeId))
	{
		if (c.self == entry_point.workgroup_size.id_x)
			index = 0;
		else if (c.self == entry_point.workgroup_size.id_y)
			index = 1;
		else if (c.self == entry_point.workgroup_size.id_z)
			index = 2;
	}

	return index;
}